

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::redirect<httplib::SSLClient>
               (SSLClient *cli,Request *req,Response *res,string *path,string *location,Error *error
               )

{
  bool bVar1;
  ssize_t sVar2;
  int __flags;
  Response new_res;
  Request new_req;
  Response local_370;
  undefined1 local_268 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  size_t local_70;
  
  __flags = (int)location;
  Request::Request((Request *)local_268,req);
  std::__cxx11::string::_M_assign((string *)(local_268 + 0x20));
  local_70 = local_70 - 1;
  if (res->status == 0x12f) {
    bVar1 = std::operator!=(&req->method,"GET");
    if (bVar1) {
      bVar1 = std::operator!=(&req->method,"HEAD");
      if (bVar1) {
        std::__cxx11::string::assign(local_268);
        local_1f0 = 0;
        *local_1f8._M_p = '\0';
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear(&local_228);
      }
    }
  }
  local_370.version._M_dataplus._M_p = (pointer)&local_370.version.field_2;
  local_370.version._M_string_length = 0;
  local_370.version.field_2._M_local_buf[0] = '\0';
  local_370.status = -1;
  local_370.reason._M_dataplus._M_p = (pointer)&local_370.reason.field_2;
  local_370.reason._M_string_length = 0;
  local_370.reason.field_2._M_local_buf[0] = '\0';
  local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_370.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_370.body._M_dataplus._M_p = (pointer)&local_370.body.field_2;
  local_370.body._M_string_length = 0;
  local_370.body.field_2._M_local_buf[0] = '\0';
  local_370.location._M_dataplus._M_p = (pointer)&local_370.location.field_2;
  local_370.location._M_string_length = 0;
  local_370.location.field_2._M_local_buf[0] = '\0';
  local_370.content_length_ = 0;
  local_370.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_370.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  local_370.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_370.content_provider_._M_invoker = (_Invoker_type)0x0;
  local_370.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object
       = (void *)0x0;
  local_370.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  local_370.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  local_370.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  local_370.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  local_370._250_8_ = 0;
  local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_370.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = ClientImpl::send(&cli->super_ClientImpl,(int)local_268,&local_370,(size_t)error,__flags);
  if ((char)sVar2 != '\0') {
    Request::operator=(req,(Request *)local_268);
    Response::operator=(res,&local_370);
    std::__cxx11::string::_M_assign((string *)&res->location);
  }
  Response::~Response(&local_370);
  Request::~Request((Request *)local_268);
  return (bool)(char)sVar2;
}

Assistant:

inline bool redirect(T& cli, Request& req, Response& res,
            const std::string& path, const std::string& location,
            Error& error) {
            Request new_req = req;
            new_req.path = path;
            new_req.redirect_count_ -= 1;

            if (res.status == 303 && (req.method != "GET" && req.method != "HEAD")) {
                new_req.method = "GET";
                new_req.body.clear();
                new_req.headers.clear();
            }

            Response new_res;

            auto ret = cli.send(new_req, new_res, error);
            if (ret) {
                req = new_req;
                res = new_res;
                res.location = location;
            }
            return ret;
        }